

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O2

_Bool options_restore_custom(player_options *opts,int page)

{
  char *__s;
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  ang_file *f;
  char *pcVar5;
  char *pcVar6;
  size_t __n;
  byte bVar7;
  uint uVar8;
  int *piVar9;
  long lVar10;
  char file_name [80];
  char buf [1024];
  char path [1024];
  
  pcVar4 = option_type_name(page);
  strnfmt(file_name,0x50,"customized_%s_options.txt",pcVar4);
  path_build(path,0x400,ANGBAND_DIR_USER,file_name);
  _Var2 = file_exists(path);
  if (_Var2) {
    uVar8 = 1;
    f = file_open(path,MODE_READ,FTYPE_TEXT);
    if (f == (ang_file *)0x0) {
      _Var2 = false;
    }
    else {
      while( true ) {
        _Var2 = file_getl(f,buf,0x400);
        if (!_Var2) break;
        pcVar5 = strstr(buf,"option:");
        if (pcVar5 == (char *)0x0) {
          pcVar6 = strchr(buf,0x23);
          if (pcVar6 != (char *)0x0) goto LAB_00193e06;
LAB_00193e09:
          _Var2 = contains_only_spaces(buf);
          if (!_Var2) {
            pcVar5 = "Line %d of the customized %s options is not parseable.";
LAB_00193e1e:
            msg(pcVar5,(ulong)uVar8,pcVar4);
          }
        }
        else {
          *pcVar5 = '\0';
          pcVar6 = strchr(buf,0x23);
          if (pcVar6 != (char *)0x0) {
LAB_00193e06:
            *pcVar6 = '\0';
            goto LAB_00193e09;
          }
          _Var2 = contains_only_spaces(buf);
          if (_Var2) {
            pcVar6 = pcVar5 + 7;
            piVar9 = &options[0].type;
            for (lVar10 = 0; lVar10 != 0x2d; lVar10 = lVar10 + 1) {
              if ((*piVar9 == page) &&
                 (__s = ((option_entry *)(piVar9 + -4))->name, __s != (char *)0x0)) {
                __n = strlen(__s);
                iVar3 = strncmp(__s,pcVar6,__n);
                if ((iVar3 == 0) && (pcVar6[__n] == ':')) {
                  bVar7 = pcVar5[__n + 8];
                  if (bVar7 - 0x79 == 0) {
                    if ((byte)pcVar6[__n + 2] - 0x65 == 0) {
                      iVar3 = 0x73 - (uint)(byte)pcVar6[__n + 3];
                    }
                    else {
                      iVar3 = -((byte)pcVar6[__n + 2] - 0x65);
                    }
                  }
                  else {
                    iVar3 = -(bVar7 - 0x79);
                  }
                  if (iVar3 == 0) {
                    _Var2 = contains_only_spaces(pcVar6 + __n + 4);
                    if (_Var2) {
                      opts->opt[lVar10] = true;
                      goto LAB_00193e56;
                    }
                    bVar7 = pcVar6[__n + 1];
                  }
                  if (bVar7 == 0x6e) {
                    bVar7 = pcVar6[__n + 2];
                    bVar1 = 0x6f;
                  }
                  else {
                    bVar1 = 0x6e;
                  }
                  if ((bVar1 != bVar7) || (_Var2 = contains_only_spaces(pcVar6 + __n + 3), !_Var2))
                  {
                    pcVar5 = "Value at line %d of the customized %s options is not yes or no.";
                    goto LAB_00193e1e;
                  }
                  opts->opt[lVar10] = false;
                  goto LAB_00193e56;
                }
              }
              piVar9 = piVar9 + 6;
            }
            pcVar5 = "Unrecognized option at line %d of the customized %s options.";
          }
          else {
            pcVar5 = "Line %d of the customized %s options is not parseable.";
          }
          msg(pcVar5,(ulong)uVar8,pcVar4);
        }
LAB_00193e56:
        uVar8 = uVar8 + 1;
      }
      _Var2 = file_close(f);
    }
  }
  else {
    options_restore_maintainer(opts,page);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool options_restore_custom(struct player_options *opts, int page)
{
	const char *page_name = option_type_name(page);
	char path[1024], buf[1024], file_name[80];
	ang_file *f;
	int linenum;

	strnfmt(file_name, sizeof(file_name), "customized_%s_options.txt",
		page_name);
	path_build(path, sizeof(path), ANGBAND_DIR_USER, file_name);
	if (!file_exists(path)) {
		options_restore_maintainer(opts, page);
		return true;
	}

	/*
	 * Could use run_parser(), but that exits the application if
	 * there are syntax errors.  Therefore, use our own parsing.
	 */
	f = file_open(path, MODE_READ, FTYPE_TEXT);
	if (!f) {
		return false;
	}
	linenum = 1;
	while (file_getl(f, buf, sizeof(buf))) {
		char *sub = strstr(buf, "option:"), *com;
		int opt;

		if (!sub) {
			/*
			 * If it isn't an option, it should be a comment or
			 * whitespace.
			 */
			sub = strchr(buf, '#');

			if (sub) {
				*sub = '\0';
			}
			if (!contains_only_spaces(buf)) {
				msg("Line %d of the customized %s options is "
					"not parseable.", linenum, page_name);
			}
			++linenum;
			continue;
		}

		*sub = '\0';
		/* Ignore if the "option:" is embedded in a comment. */
		com = strchr(buf, '#');
		if (com) {
			*com = '\0';
			if (!contains_only_spaces(buf)) {
				msg("Line %d of the customized %s options is "
					"not parseable.", linenum, page_name);
			}
			++linenum;
			continue;
		}
		if (!contains_only_spaces(buf)) {
			msg("Line %d of the customized %s options is not "
					"parseable.", linenum, page_name);
			++linenum;
			continue;
		}

		/* Try to find the option. */
		sub += 7;
		opt = 0;
		while (1) {
			size_t lname;

			if (opt >= OPT_MAX) {
				msg("Unrecognized option at line %d of the "
					"customized %s options.", linenum,
					page_name);
				break;
			}
			if (options[opt].type != page || !options[opt].name) {
				++opt;
				continue;
			}
			lname = strlen(options[opt].name);
			if (strncmp(options[opt].name, sub, lname) == 0
					&& sub[lname] == ':') {
				if (strncmp("yes", sub + lname + 1, 3) == 0
						&& contains_only_spaces(sub + lname + 4)) {
					(*opts).opt[opt] = true;
				} else if (strncmp("no", sub + lname + 1, 2) == 0
						&& contains_only_spaces(sub + lname + 3)) {
					(*opts).opt[opt] = false;
				} else {
					msg("Value at line %d of the "
						"customized %s options is not "
						"yes or no.", linenum,
						page_name);
				}
				break;
			}
			++opt;
		}
		++linenum;
	}

	if (!file_close(f)) {
		return false;
	}

	return true;
}